

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O3

void asm_fusefref(ASMState *as,IRIns *ir,RegSet allow)

{
  ushort uVar1;
  IRIns *pIVar2;
  uint uVar3;
  Reg RVar4;
  byte bVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  
  (as->mrm).idx = 0x80;
  if ((ir->field_0).op1 == 0x7fff) {
    uVar3 = (uint)(ir->field_0).op2 * 4;
LAB_0013f2f5:
    (as->mrm).ofs = uVar3 - 0xfe0;
  }
  else {
    bVar5 = "\x14\x10 \nH \x10(04\n \n008@HPX\n\x10\x10\x10\x14"[(ir->field_0).op2];
    (as->mrm).ofs = (uint)bVar5;
    uVar1 = (ir->field_0).op1;
    uVar6 = (ulong)uVar1;
    pIVar2 = as->ir;
    if ((short)uVar1 < 0) {
LAB_0013f32f:
      bVar5 = *(byte *)((long)pIVar2 + uVar6 * 8 + 6);
      if ((char)bVar5 < '\0') {
        RVar4 = ra_allocref(as,(uint)uVar1,allow);
        bVar5 = (byte)RVar4;
      }
      as->weakset = as->weakset & (-2 << (bVar5 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar5 & 0x1f));
      goto LAB_0013f34f;
    }
    uVar3 = (uint)bVar5;
    if (uVar1 == 0x7fff) goto LAB_0013f2f5;
    if ((1 < (byte)(*(char *)((long)pIVar2 + uVar6 * 8 + 5) - 0x19U)) ||
       (lVar7 = (long)pIVar2[uVar6 + 1] - (long)as->J, lVar8 = (ulong)(uint)bVar5 + lVar7 + -0xca8,
       (int)lVar8 != lVar8)) goto LAB_0013f32f;
    (as->mrm).ofs = (int)lVar7 + -0xca8 + uVar3;
  }
  bVar5 = 0xe;
LAB_0013f34f:
  (as->mrm).base = bVar5;
  return;
}

Assistant:

static void asm_fusefref(ASMState *as, IRIns *ir, RegSet allow)
{
  lj_assertA(ir->o == IR_FLOAD || ir->o == IR_FREF,
	     "bad IR op %d", ir->o);
  as->mrm.idx = RID_NONE;
  if (ir->op1 == REF_NIL) {  /* FLOAD from GG_State with offset. */
#if LJ_GC64
    as->mrm.ofs = (int32_t)(ir->op2 << 2) - GG_OFS(dispatch);
    as->mrm.base = RID_DISPATCH;
#else
    as->mrm.ofs = (int32_t)(ir->op2 << 2) + ptr2addr(J2GG(as->J));
    as->mrm.base = RID_NONE;
#endif
    return;
  }
  as->mrm.ofs = field_ofs[ir->op2];
  if (irref_isk(ir->op1)) {
    IRIns *op1 = IR(ir->op1);
#if LJ_GC64
    if (ir->op1 == REF_NIL) {
      as->mrm.ofs -= GG_OFS(dispatch);
      as->mrm.base = RID_DISPATCH;
      return;
    } else if (op1->o == IR_KPTR || op1->o == IR_KKPTR) {
      intptr_t ofs = dispofs(as, ir_kptr(op1));
      if (checki32(as->mrm.ofs + ofs)) {
	as->mrm.ofs += (int32_t)ofs;
	as->mrm.base = RID_DISPATCH;
	return;
      }
    }
#else
    as->mrm.ofs += op1->i;
    as->mrm.base = RID_NONE;
    return;
#endif
  }
  as->mrm.base = (uint8_t)ra_alloc1(as, ir->op1, allow);
}